

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

string * ElideMiddle(string *__return_storage_ptr__,string *str,size_t width)

{
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  switch(width) {
  case 0:
    __s = "";
    break;
  case 1:
    __s = ".";
    break;
  case 2:
    __s = "..";
    break;
  case 3:
    __s = "...";
    break;
  default:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
    if (__return_storage_ptr__->_M_string_length <= width) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)__return_storage_ptr__);
    std::operator+(&local_30,&local_50,"...");
    std::__cxx11::string::substr((ulong)&local_70,(ulong)__return_storage_ptr__);
    std::operator+(&local_90,&local_30,&local_70);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

string ElideMiddle(const string& str, size_t width) {
  switch (width) {
      case 0: return "";
      case 1: return ".";
      case 2: return "..";
      case 3: return "...";
  }
  const int kMargin = 3;  // Space for "...".
  string result = str;
  if (result.size() > width) {
    size_t elide_size = (width - kMargin) / 2;
    result = result.substr(0, elide_size)
      + "..."
      + result.substr(result.size() - elide_size, elide_size);
  }
  return result;
}